

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O3

void Gia_ManDupCollapse_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Man_t *pNew)

{
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  pGVar2 = p->pObjs;
  if ((pGVar2 <= pObj) && (pObj < pGVar2 + p->nObjs)) {
    iVar3 = (int)((long)pObj - (long)pGVar2 >> 2) * -0x55555555;
    if (p->nTravIdsAlloc <= iVar3) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (p->pTravIds[iVar3] != p->nTravIds) {
      p->pTravIds[iVar3] = p->nTravIds;
      if (((int)(uint)*(undefined8 *)pObj < 0) ||
         (uVar4 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar5 = (ulong)uVar4, uVar4 == 0x1fffffff)
         ) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                      ,0x318,"void Gia_ManDupCollapse_rec(Gia_Man_t *, Gia_Obj_t *, Gia_Man_t *)");
      }
      if (pGVar2 + p->nObjs <= pObj) goto LAB_00235696;
      if (p->pSibls != (int *)0x0) {
        uVar4 = p->pSibls[iVar3];
        if ((ulong)uVar4 != 0) {
          if (((int)uVar4 < 0) || (p->nObjs <= (int)uVar4)) goto LAB_00235712;
          Gia_ManDupCollapse_rec(p,pGVar2 + uVar4,pNew);
          uVar5 = (ulong)((uint)*(undefined8 *)pObj & 0x1fffffff);
        }
      }
      Gia_ManDupCollapse_rec(p,pObj + -uVar5,pNew);
      Gia_ManDupCollapse_rec(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),pNew);
      uVar5 = *(ulong *)pObj;
      if (((int)pObj[-(uVar5 & 0x1fffffff)].Value < 0) ||
         (uVar4 = (uint)(uVar5 >> 0x20), (int)pObj[-(ulong)(uVar4 & 0x1fffffff)].Value < 0)) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar4 = Gia_ManHashAnd(pNew,(uint)(uVar5 >> 0x1d) & 1 ^ pObj[-(uVar5 & 0x1fffffff)].Value,
                             pObj[-(ulong)(uVar4 & 0x1fffffff)].Value ^ uVar4 >> 0x1d & 1);
      pObj->Value = uVar4;
      pGVar2 = p->pObjs;
      if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) goto LAB_00235696;
      if (p->pSibls != (int *)0x0) {
        uVar1 = p->pSibls[(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555];
        if ((ulong)uVar1 != 0) {
          if (((int)uVar1 < 0) || (p->nObjs <= (int)uVar1)) {
LAB_00235712:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (((int)pGVar2[uVar1].Value < 0) || ((int)uVar4 < 0)) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          pNew->pSibls[uVar4 >> 1] = pGVar2[uVar1].Value >> 1;
        }
      }
    }
    return;
  }
LAB_00235696:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManDupCollapse_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Man_t * pNew )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    assert( Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
        Gia_ManDupCollapse_rec( p, Gia_ObjSiblObj(p, Gia_ObjId(p, pObj)), pNew );
    Gia_ManDupCollapse_rec( p, Gia_ObjFanin0(pObj), pNew );
    Gia_ManDupCollapse_rec( p, Gia_ObjFanin1(pObj), pNew );
//    assert( !~pObj->Value );
    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
        pNew->pSibls[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var(Gia_ObjSiblObj(p, Gia_ObjId(p, pObj))->Value);        
}